

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c++
# Opt level: O0

uint64_t capnp::compiler::generateRandomId(void)

{
  bool bVar1;
  int iVar2;
  void *pvVar3;
  Fault local_b0;
  Fault f_2;
  long *local_a0;
  undefined1 local_98 [8];
  DebugComparison<long_&,_unsigned_long> _kjCondition;
  Fault f_1;
  SyscallResult local_4c;
  undefined1 local_48 [4];
  SyscallResult _kjSyscallResult_1;
  ssize_t n;
  Fault local_30;
  Fault f;
  SyscallResult local_1c;
  undefined1 local_18 [4];
  SyscallResult _kjSyscallResult;
  int _kj_fd;
  OwnFd fd;
  uint64_t result;
  
  f.exception = (Exception *)local_18;
  local_1c = kj::_::Debug::syscall<capnp::compiler::generateRandomId()::__0>
                       ((anon_class_8_1_4955c7dd *)&f,false);
  pvVar3 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_1c);
  if (pvVar3 == (void *)0x0) {
    iVar2 = kj::_::Debug::SyscallResult::getErrorNumber(&local_1c);
    kj::_::Debug::Fault::Fault
              (&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/parser.c++"
               ,0x3d,iVar2,"_kj_fd = open(\"/dev/urandom\", 00)","");
    kj::_::Debug::Fault::fatal(&local_30);
  }
  kj::OwnFd::OwnFd((OwnFd *)&_kjSyscallResult,(int)local_18);
  f_1.exception = (Exception *)local_48;
  local_4c = kj::_::Debug::syscall<capnp::compiler::generateRandomId()::__1>
                       ((anon_class_24_3_7261f716 *)&f_1,false);
  pvVar3 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_4c);
  if (pvVar3 != (void *)0x0) {
    local_a0 = (long *)kj::_::DebugExpressionStart::operator<<
                                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(long *)local_48);
    f_2.exception = (Exception *)0x8;
    kj::_::DebugExpression<long&>::operator==
              ((DebugComparison<long_&,_unsigned_long> *)local_98,
               (DebugExpression<long&> *)&local_a0,(unsigned_long *)&f_2);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_98);
    if (!bVar1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<long&,unsigned_long>&,char_const(&)[35],long&>
                (&local_b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/parser.c++"
                 ,0x41,FAILED,"n == sizeof(result)",
                 "_kjCondition,\"Incomplete read from /dev/urandom.\", n",
                 (DebugComparison<long_&,_unsigned_long> *)local_98,
                 (char (*) [35])"Incomplete read from /dev/urandom.",(long *)local_48);
      kj::_::Debug::Fault::fatal(&local_b0);
    }
    kj::OwnFd::~OwnFd((OwnFd *)&_kjSyscallResult);
    return (ulong)__kj_fd | 0x8000000000000000;
  }
  iVar2 = kj::_::Debug::SyscallResult::getErrorNumber(&local_4c);
  kj::_::Debug::Fault::Fault<int,char_const(&)[13]>
            ((Fault *)&_kjCondition.result,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/parser.c++"
             ,0x40,iVar2,"n = read(fd, &result, sizeof(result))","\"/dev/urandom\"",
             (char (*) [13])"/dev/urandom");
  kj::_::Debug::Fault::fatal((Fault *)&_kjCondition.result);
}

Assistant:

uint64_t generateRandomId() {
  uint64_t result;

#if _WIN32
  HCRYPTPROV handle;
  KJ_ASSERT(CryptAcquireContextW(&handle, nullptr, nullptr,
                                 PROV_RSA_FULL, CRYPT_VERIFYCONTEXT | CRYPT_SILENT));
  KJ_DEFER(KJ_ASSERT(CryptReleaseContext(handle, 0)) {break;});

  KJ_ASSERT(CryptGenRandom(handle, sizeof(result), reinterpret_cast<BYTE*>(&result)));

#else
  auto fd = KJ_SYSCALL_FD(open("/dev/urandom", O_RDONLY));

  ssize_t n;
  KJ_SYSCALL(n = read(fd, &result, sizeof(result)), "/dev/urandom");
  KJ_ASSERT(n == sizeof(result), "Incomplete read from /dev/urandom.", n);
#endif

  return result | (1ull << 63);
}